

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O3

void aom_get_var_sse_sum_16x16_dual_sse2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse16x16,
               uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  bool bVar25;
  int *piVar26;
  bool bVar27;
  undefined1 (*pauVar28) [16];
  int iVar29;
  long lVar30;
  undefined1 (*pauVar31) [16];
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int local_38;
  int local_34;
  
  lVar30 = 0;
  local_38 = 0;
  local_34 = 0;
  piVar26 = &local_38;
  bVar25 = true;
  do {
    bVar27 = bVar25;
    pauVar28 = (undefined1 (*) [16])(ref_ptr + lVar30 * 0x10);
    pauVar31 = (undefined1 (*) [16])(src_ptr + lVar30 * 0x10);
    iVar40 = 0;
    iVar41 = 0;
    iVar42 = 0;
    iVar43 = 0;
    iVar29 = 0x10;
    sVar32 = 0;
    sVar33 = 0;
    sVar34 = 0;
    sVar35 = 0;
    sVar36 = 0;
    sVar37 = 0;
    sVar38 = 0;
    sVar39 = 0;
    do {
      auVar45 = *pauVar31;
      auVar1[0xd] = 0;
      auVar1._0_13_ = auVar45._0_13_;
      auVar1[0xe] = auVar45[7];
      auVar3[0xc] = auVar45[6];
      auVar3._0_12_ = auVar45._0_12_;
      auVar3._13_2_ = auVar1._13_2_;
      auVar5[0xb] = 0;
      auVar5._0_11_ = auVar45._0_11_;
      auVar5._12_3_ = auVar3._12_3_;
      auVar7[10] = auVar45[5];
      auVar7._0_10_ = auVar45._0_10_;
      auVar7._11_4_ = auVar5._11_4_;
      auVar9[9] = 0;
      auVar9._0_9_ = auVar45._0_9_;
      auVar9._10_5_ = auVar7._10_5_;
      auVar11[8] = auVar45[4];
      auVar11._0_8_ = auVar45._0_8_;
      auVar11._9_6_ = auVar9._9_6_;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = auVar11._8_7_;
      Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),auVar45[3]);
      auVar21._9_6_ = 0;
      auVar21._0_9_ = Var16;
      auVar17._1_10_ = SUB1510(auVar21 << 0x30,5);
      auVar17[0] = auVar45[2];
      auVar22._11_4_ = 0;
      auVar22._0_11_ = auVar17;
      auVar13[2] = auVar45[1];
      auVar13._0_2_ = auVar45._0_2_;
      auVar13._3_12_ = SUB1512(auVar22 << 0x20,3);
      auVar47 = *pauVar28;
      auVar2[0xd] = 0;
      auVar2._0_13_ = auVar47._0_13_;
      auVar2[0xe] = auVar47[7];
      auVar4[0xc] = auVar47[6];
      auVar4._0_12_ = auVar47._0_12_;
      auVar4._13_2_ = auVar2._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar47._0_11_;
      auVar6._12_3_ = auVar4._12_3_;
      auVar8[10] = auVar47[5];
      auVar8._0_10_ = auVar47._0_10_;
      auVar8._11_4_ = auVar6._11_4_;
      auVar10[9] = 0;
      auVar10._0_9_ = auVar47._0_9_;
      auVar10._10_5_ = auVar8._10_5_;
      auVar12[8] = auVar47[4];
      auVar12._0_8_ = auVar47._0_8_;
      auVar12._9_6_ = auVar10._9_6_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar12._8_7_;
      Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar47[3]);
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var19;
      auVar20._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar20[0] = auVar47[2];
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar20;
      auVar14[2] = auVar47[1];
      auVar14._0_2_ = auVar47._0_2_;
      auVar14._3_12_ = SUB1512(auVar24 << 0x20,3);
      auVar46._0_2_ = (auVar45._0_2_ & 0xff) - (auVar47._0_2_ & 0xff);
      auVar46._2_2_ = auVar13._2_2_ - auVar14._2_2_;
      auVar46._4_2_ = auVar17._0_2_ - auVar20._0_2_;
      auVar46._6_2_ = (short)Var16 - (short)Var19;
      auVar46._8_2_ = auVar11._8_2_ - auVar12._8_2_;
      auVar46._10_2_ = auVar7._10_2_ - auVar8._10_2_;
      auVar46._12_2_ = auVar3._12_2_ - auVar4._12_2_;
      auVar46._14_2_ = (auVar1._13_2_ >> 8) - (auVar2._13_2_ >> 8);
      auVar44._0_2_ = (ushort)auVar45[8] - (ushort)auVar47[8];
      auVar44._2_2_ = (ushort)auVar45[9] - (ushort)auVar47[9];
      auVar44._4_2_ = (ushort)auVar45[10] - (ushort)auVar47[10];
      auVar44._6_2_ = (ushort)auVar45[0xb] - (ushort)auVar47[0xb];
      auVar44._8_2_ = (ushort)auVar45[0xc] - (ushort)auVar47[0xc];
      auVar44._10_2_ = (ushort)auVar45[0xd] - (ushort)auVar47[0xd];
      auVar44._12_2_ = (ushort)auVar45[0xe] - (ushort)auVar47[0xe];
      auVar44._14_2_ = (ushort)auVar45[0xf] - (ushort)auVar47[0xf];
      sVar32 = sVar32 + auVar44._0_2_ + auVar46._0_2_;
      sVar33 = sVar33 + auVar44._2_2_ + auVar46._2_2_;
      sVar34 = sVar34 + auVar44._4_2_ + auVar46._4_2_;
      sVar35 = sVar35 + auVar44._6_2_ + auVar46._6_2_;
      sVar36 = sVar36 + auVar44._8_2_ + auVar46._8_2_;
      sVar37 = sVar37 + auVar44._10_2_ + auVar46._10_2_;
      sVar38 = sVar38 + auVar44._12_2_ + auVar46._12_2_;
      sVar39 = sVar39 + auVar44._14_2_ + auVar46._14_2_;
      auVar47 = pmaddwd(auVar46,auVar46);
      auVar45 = pmaddwd(auVar44,auVar44);
      iVar40 = auVar45._0_4_ + auVar47._0_4_ + iVar40;
      iVar41 = auVar45._4_4_ + auVar47._4_4_ + iVar41;
      iVar42 = auVar45._8_4_ + auVar47._8_4_ + iVar42;
      iVar43 = auVar45._12_4_ + auVar47._12_4_ + iVar43;
      pauVar28 = (undefined1 (*) [16])(*pauVar28 + ref_stride);
      pauVar31 = (undefined1 (*) [16])(*pauVar31 + src_stride);
      iVar29 = iVar29 + -1;
    } while (iVar29 != 0);
    sse16x16[lVar30] = iVar43 + iVar41 + iVar42 + iVar40;
    *piVar26 = (int)(short)(sVar39 + sVar35 + sVar37 + sVar33) +
               (int)(short)(sVar38 + sVar34 + sVar36 + sVar32);
    lVar30 = 1;
    piVar26 = &local_34;
    bVar25 = false;
  } while (bVar27);
  *tot_sse = *tot_sse + sse16x16[1] + *sse16x16;
  *tot_sum = *tot_sum + local_34 + local_38;
  *var16x16 = *sse16x16 - (int)((ulong)((long)local_38 * (long)local_38) >> 8);
  var16x16[1] = sse16x16[1] - (int)((ulong)((long)local_34 * (long)local_34) >> 8);
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_sse2(const uint8_t *src_ptr, int src_stride,
                                         const uint8_t *ref_ptr, int ref_stride,
                                         uint32_t *sse16x16,
                                         unsigned int *tot_sse, int *tot_sum,
                                         uint32_t *var16x16) {
  int sum16x16[2] = { 0 };
  // Loop over 2 16x16 blocks. Process one 16x32 block.
  for (int k = 0; k < 2; k++) {
    const uint8_t *src = src_ptr;
    const uint8_t *ref = ref_ptr;
    __m128i vsum = _mm_setzero_si128();
    __m128i vsse = _mm_setzero_si128();
    for (int i = 0; i < 16; i++) {
      __m128i s[2];
      __m128i r[2];
      load16_8to16_sse2(src + (k * 16), s);
      load16_8to16_sse2(ref + (k * 16), r);
      const __m128i diff0 = _mm_sub_epi16(s[0], r[0]);
      const __m128i diff1 = _mm_sub_epi16(s[1], r[1]);
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff0, diff0));
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff1, diff1));
      vsum = _mm_add_epi16(vsum, _mm_add_epi16(diff0, diff1));
      src += src_stride;
      ref += ref_stride;
    }
    variance_final_256_pel_sse2(vsse, vsum, &sse16x16[k], &sum16x16[k]);
  }

  // Calculate variance at 16x16 level and total sse, sum of 16x32 block.
  *tot_sse += sse16x16[0] + sse16x16[1];
  *tot_sum += sum16x16[0] + sum16x16[1];
  for (int i = 0; i < 2; i++)
    var16x16[i] =
        sse16x16[i] - (uint32_t)(((int64_t)sum16x16[i] * sum16x16[i]) >> 8);
}